

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O0

string * mod_string_by_creating_temp(string *__return_storage_ptr__,string *s1,string *s2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *s2_local;
  string *s1_local;
  string *temp;
  
  local_21 = 0;
  local_20 = s2;
  s2_local = s1;
  s1_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_68,local_20,s2_local);
  std::operator+(&local_48,&local_68,local_20);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string mod_string_by_creating_temp(const std::string & s1, const std::string & s2) {
    std::string temp;
    temp = s2 + s1 + s2;
    //  返回一份 string 的复制
    return temp;
}